

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O0

ThreadId __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
start<implementations::scheme::eval(implementations::scheme::SchemeThreadManager&,implementations::scheme::cell_const&,std::shared_ptr<implementations::scheme::environment>)::__0>
          (MicrothreadManager<implementations::scheme::SchemeImplementation> *this,
          anon_class_24_2_441b16a8 *cb,CycleCount cycle_count)

{
  undefined4 uVar1;
  CycleCount in_R8D;
  pair<unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>
  local_160;
  undefined1 local_c0 [32];
  _thread_type thread;
  ThreadId thread_id;
  CycleCount cycle_count_local;
  anon_class_24_2_441b16a8 *cb_local;
  MicrothreadManager<implementations::scheme::SchemeImplementation> *this_local;
  
  thread._128_4_ = this->thread_counter;
  this->thread_counter = thread._128_4_ + 1;
  thread._132_4_ = cycle_count;
  implementations::scheme::
  eval(implementations::scheme::SchemeThreadManager&,implementations::scheme::cell_const&,std::shared_ptr<implementations::scheme::environment>)
  ::$_0::__0((__0 *)local_c0,cb);
  Microthread<implementations::scheme::SchemeImplementation>::
  create<implementations::scheme::eval(implementations::scheme::SchemeThreadManager&,implementations::scheme::cell_const&,std::shared_ptr<implementations::scheme::environment>)::__0>
            ((_thread_type *)(local_c0 + 0x18),
             (Microthread<implementations::scheme::SchemeImplementation> *)local_c0,
             (anon_class_24_2_441b16a8 *)(ulong)(uint)thread._128_4_,thread._132_4_,in_R8D);
  implementations::scheme::
  eval(implementations::scheme::SchemeThreadManager&,implementations::scheme::cell_const&,std::shared_ptr<implementations::scheme::environment>)
  ::$_0::~__0((__0 *)local_c0);
  std::
  pair<unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>
  ::
  pair<unsigned_int_&,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_&,_true>
            (&local_160,(uint *)&thread.sleeping,
             (Microthread<implementations::scheme::SchemeImplementation> *)(local_c0 + 0x18));
  std::
  map<unsigned_int,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>>
  ::
  insert<std::pair<unsigned_int,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>
            ((map<unsigned_int,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>>
              *)&this->threads,&local_160);
  std::
  pair<unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>
  ::~pair(&local_160);
  uVar1 = thread._128_4_;
  Microthread<implementations::scheme::SchemeImplementation>::~Microthread
            ((Microthread<implementations::scheme::SchemeImplementation> *)(local_c0 + 0x18));
  return uVar1;
}

Assistant:

ThreadId start(Callback cb, const CycleCount cycle_count = cycles_med) {
				ThreadId thread_id = thread_counter++;
				_thread_type thread(_thread_type::template create<Callback>(cb, thread_id, cycle_count));
				threads.insert(_threads_ele(thread_id, thread));
				return thread_id;
			}